

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

void LTACMasterdataChannel::UnregisterMasterDataChn(LTACMasterdataChannel *pChn)

{
  system_error *e;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffffd0;
  char local_8 [8];
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::remove
            (&lstChn_abi_cxx11_,local_8);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c5609);
  return;
}

Assistant:

void LTACMasterdataChannel::UnregisterMasterDataChn (LTACMasterdataChannel* pChn)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        // just remove the channel
        lstChn.remove(pChn);
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
}